

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

TargetList *
Analyser::Static::DiskII::GetTargets
          (TargetList *__return_storage_ptr__,Media *media,string *param_2,IntType param_3)

{
  initializer_list<unsigned_short> __l;
  string *psVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *track;
  reference ppVar4;
  Target *pTVar5;
  reference pvVar6;
  pointer pTVar7;
  reference ppVar8;
  size_t *psVar9;
  reference puVar10;
  bool local_411;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> local_3a8;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> local_3a0;
  ushort local_392;
  iterator iStack_390;
  unsigned_short address;
  iterator __end1_2;
  iterator __begin1_2;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *__range1_2;
  pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction> *instruction;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  map<unsigned_short,_Analyser::Static::MOS6502::Instruction,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>_>
  *__range1_1;
  bool is_oric;
  bool did_read_shift_register;
  iterator puStack_350;
  size_type local_348;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_340;
  function<unsigned_long_(int)> local_328;
  function<unsigned_long_(unsigned_short)> local_308;
  undefined1 local_2e8 [8];
  Disassembly disassembly;
  pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector> *pair;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
  *__range1;
  Sector *sector_zero;
  PCMSegment local_100;
  undefined1 local_a8 [8];
  map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
  sector_map;
  Address local_70;
  undefined1 local_68 [8];
  shared_ptr<Storage::Disk::Track> track_zero;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> local_50;
  HeadPosition local_48 [4];
  HeadPosition local_38;
  byte local_31;
  __shared_ptr_access<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_30;
  value_type *disk;
  string *psStack_20;
  IntType param_2_local;
  string *param_1_local;
  Media *media_local;
  TargetList *targets;
  
  disk._4_4_ = param_3;
  psStack_20 = param_2;
  param_1_local = (string *)media;
  media_local = (Media *)__return_storage_ptr__;
  bVar2 = std::
          vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
          ::empty(&media->disks);
  if (bVar2) {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    local_30 = (__shared_ptr_access<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )std::
                vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                ::front((vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                         *)param_1_local);
    local_31 = 0;
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::vector(__return_storage_ptr__);
    peVar3 = std::__shared_ptr_access<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_30);
    local_38.position_ = (*peVar3->_vptr_Disk[2])();
    Storage::Disk::HeadPosition::HeadPosition(local_48,0x28);
    bVar2 = Storage::Disk::HeadPosition::operator>(&local_38,local_48);
    if (bVar2) {
      pTVar5 = anon_unknown.dwarf_22fddc::AppleIIgsTarget();
      std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>::
      unique_ptr<std::default_delete<Analyser::Static::Target>,void>
                ((unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>
                  *)&local_50,pTVar5);
      std::
      vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_50);
      std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>::
      ~unique_ptr(&local_50);
      psVar1 = param_1_local;
      pvVar6 = std::
               vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
               ::back(__return_storage_ptr__);
      pTVar7 = std::
               unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
               ::operator->(pvVar6);
      Media::operator=(&pTVar7->media,(Media *)psVar1);
      local_31 = 1;
      track_zero.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 1;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_30);
      Storage::Disk::HeadPosition::HeadPosition
                ((HeadPosition *)
                 ((long)&sector_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),0);
      Storage::Disk::Track::Address::Address
                (&local_70,0,sector_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      (*peVar3->_vptr_Disk[4])(local_68,peVar3,local_70);
      track = std::
              __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
      Storage::Time::Time((Time *)&sector_zero,1,50000);
      Storage::Disk::track_serialisation(&local_100,track,(Time)sector_zero);
      Storage::Encodings::AppleGCR::sectors_from_segment
                ((map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
                  *)local_a8,&local_100);
      Storage::Disk::PCMSegment::~PCMSegment(&local_100);
      __range1 = (map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
                  *)0x0;
      __end1 = std::
               map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
               ::begin((map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
                        *)local_a8);
      pair = (pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector> *)
             std::
             map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
             ::end((map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
                    *)local_a8);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&pair), bVar2) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>
                 ::operator*(&__end1);
        if ((ppVar4->second).address.sector == '\0') {
          __range1 = (map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
                      *)&ppVar4->second;
          break;
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>
        ::operator++(&__end1);
      }
      if (__range1 ==
          (map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
           *)0x0) {
        bVar2 = std::
                map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
                ::empty((map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
                         *)local_a8);
        if (bVar2) {
          local_31 = 1;
          track_zero.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 1;
        }
        else {
          pTVar5 = anon_unknown.dwarf_22fddc::AppleIITarget((Sector *)0x0);
          psVar9 = &disassembly.internal_modifies._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>::
          unique_ptr<std::default_delete<Analyser::Static::Target>,void>
                    ((unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>
                      *)psVar9,pTVar5);
          std::
          vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)psVar9);
          std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
          ::~unique_ptr((unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                         *)&disassembly.internal_modifies._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
          psVar1 = param_1_local;
          pvVar6 = std::
                   vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                   ::back(__return_storage_ptr__);
          pTVar7 = std::
                   unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                   ::operator->(pvVar6);
          Media::operator=(&pTVar7->media,(Media *)psVar1);
          local_31 = 1;
          track_zero.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 1;
        }
      }
      else {
        Disassembler::OffsetMapper<int>(&local_328,0xb800);
        std::function<unsigned_long(unsigned_short)>::
        function<std::function<unsigned_long(int)>,void>
                  ((function<unsigned_long(unsigned_short)> *)&local_308,&local_328);
        __range1_1._6_2_ = 0xb800;
        puStack_350 = (iterator)((long)&__range1_1 + 6);
        local_348 = 1;
        std::allocator<unsigned_short>::allocator
                  ((allocator<unsigned_short> *)((long)&__range1_1 + 5));
        __l._M_len = local_348;
        __l._M_array = puStack_350;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&local_340,__l,(allocator<unsigned_short> *)((long)&__range1_1 + 5));
        MOS6502::Disassemble
                  ((Disassembly *)local_2e8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &(__range1->_M_t)._M_impl.super__Rb_tree_header,&local_308,&local_340);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_340);
        std::allocator<unsigned_short>::~allocator
                  ((allocator<unsigned_short> *)((long)&__range1_1 + 5));
        std::function<unsigned_long_(unsigned_short)>::~function(&local_308);
        std::function<unsigned_long_(int)>::~function(&local_328);
        __range1_1._4_1_ = 0;
        __range1_1._3_1_ = 0;
        __end1_1 = std::
                   map<unsigned_short,_Analyser::Static::MOS6502::Instruction,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>_>
                   ::begin((map<unsigned_short,_Analyser::Static::MOS6502::Instruction,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>_>
                            *)local_2e8);
        instruction = (pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction> *)
                      std::
                      map<unsigned_short,_Analyser::Static::MOS6502::Instruction,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>_>
                      ::end((map<unsigned_short,_Analyser::Static::MOS6502::Instruction,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>_>
                             *)local_2e8);
        while (bVar2 = std::operator!=(&__end1_1,(_Self *)&instruction), bVar2) {
          ppVar8 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>
                   ::operator*(&__end1_1);
          if (((((ppVar8->second).operation == LDA) || ((ppVar8->second).operation == LDX)) ||
              ((ppVar8->second).operation == LDY)) &&
             (((ppVar8->second).addressing_mode == Absolute && ((ppVar8->second).address == 0x31c)))
             ) {
            __range1_1._4_1_ = 1;
          }
          else if ((__range1_1._4_1_ & 1) != 0) {
            if (((ppVar8->second).operation == BPL) && ((ppVar8->second).address == 0xfb)) {
              __range1_1._3_1_ = 1;
              break;
            }
            __range1_1._4_1_ = 0;
          }
          std::
          _Rb_tree_const_iterator<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>
          ::operator++(&__end1_1);
        }
        psVar9 = &disassembly.instructions_by_address._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count;
        __end1_2 = std::
                   set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::
                   begin((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                          *)psVar9);
        iStack_390 = std::
                     set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                     ::end((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                            *)psVar9);
        while (bVar2 = std::operator!=(&__end1_2,&stack0xfffffffffffffc70), bVar2) {
          puVar10 = std::_Rb_tree_const_iterator<unsigned_short>::operator*(&__end1_2);
          local_392 = *puVar10;
          local_411 = 799 < local_392 && local_392 < 0x400;
          __range1_1._3_1_ = (__range1_1._3_1_ & 1) != 0 || local_411;
          std::_Rb_tree_const_iterator<unsigned_short>::operator++(&__end1_2);
        }
        if ((__range1_1._3_1_ & 1) == 0) {
          pTVar5 = anon_unknown.dwarf_22fddc::AppleIITarget((Sector *)__range1);
          std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>::
          unique_ptr<std::default_delete<Analyser::Static::Target>,void>
                    ((unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>
                      *)&local_3a8,pTVar5);
          std::
          vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&local_3a8);
          std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
          ::~unique_ptr(&local_3a8);
        }
        else {
          pTVar5 = anon_unknown.dwarf_22fddc::OricTarget((Sector *)__range1);
          std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>::
          unique_ptr<std::default_delete<Analyser::Static::Target>,void>
                    ((unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>
                      *)&local_3a0,pTVar5);
          std::
          vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&local_3a0);
          std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
          ::~unique_ptr(&local_3a0);
        }
        psVar1 = param_1_local;
        pvVar6 = std::
                 vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
                 ::back(__return_storage_ptr__);
        pTVar7 = std::
                 unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                 ::operator->(pvVar6);
        Media::operator=(&pTVar7->media,(Media *)psVar1);
        local_31 = 1;
        track_zero.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 1;
        MOS6502::Disassembly::~Disassembly((Disassembly *)local_2e8);
      }
      std::
      map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
      ::~map((map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
              *)local_a8);
      std::shared_ptr<Storage::Disk::Track>::~shared_ptr
                ((shared_ptr<Storage::Disk::Track> *)local_68);
    }
    if ((local_31 & 1) == 0) {
      std::
      vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
      ::~vector(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Analyser::Static::TargetList Analyser::Static::DiskII::GetTargets(const Media &media, const std::string &, TargetPlatform::IntType) {
	// This analyser can comprehend disks only.
	if(media.disks.empty()) return {};

	auto &disk = media.disks.front();
	TargetList targets;

	// If the disk image is too large for a 5.25" disk, map this to the IIgs.
	if(disk->get_maximum_head_position() > Storage::Disk::HeadPosition(40)) {
		targets.push_back(std::unique_ptr<Analyser::Static::Target>(AppleIIgsTarget()));
		targets.back()->media = media;
		return targets;
	}

	// Grab track 0, sector 0: the boot sector.
	const auto track_zero = disk->get_track_at_position(Storage::Disk::Track::Address(0, Storage::Disk::HeadPosition(0)));
	const auto sector_map = Storage::Encodings::AppleGCR::sectors_from_segment(
		Storage::Disk::track_serialisation(*track_zero, Storage::Time(1, 50000)));

	const Storage::Encodings::AppleGCR::Sector *sector_zero = nullptr;
	for(const auto &pair: sector_map) {
		if(!pair.second.address.sector) {
			sector_zero = &pair.second;
			break;
		}
	}

	// If there's no boot sector then if there are also no sectors at all,
	// decline to nominate a machine. Otherwise go with an Apple as the default.
	if(!sector_zero) {
		if(sector_map.empty()) {
			return targets;
		} else {
			targets.push_back(std::unique_ptr<Analyser::Static::Target>(AppleIITarget(nullptr)));
			targets.back()->media = media;
			return targets;
		}
	}

	// If the boot sector looks like it's intended for the Oric, create an Oric.
	// Otherwise go with the Apple II.

	const auto disassembly = Analyser::Static::MOS6502::Disassemble(sector_zero->data, Analyser::Static::Disassembler::OffsetMapper(0xb800), {0xb800});

	bool did_read_shift_register = false;
	bool is_oric = false;

	// Look for a tight BPL loop reading the Oric's shift register address of 0x31c. The Apple II just has RAM there,
	// so the probability of such a loop is infinitesimal.
	for(const auto &instruction: disassembly.instructions_by_address) {
		// Is this a read of the shift register?
		if(
			(
				(instruction.second.operation == Analyser::Static::MOS6502::Instruction::LDA) ||
				(instruction.second.operation == Analyser::Static::MOS6502::Instruction::LDX) ||
				(instruction.second.operation == Analyser::Static::MOS6502::Instruction::LDY)
			) &&
			instruction.second.addressing_mode == Analyser::Static::MOS6502::Instruction::Absolute &&
			instruction.second.address == 0x031c) {
			did_read_shift_register = true;
			continue;
		}

		if(did_read_shift_register) {
			if(
				instruction.second.operation == Analyser::Static::MOS6502::Instruction::BPL &&
				instruction.second.address == 0xfb) {
				is_oric = true;
				break;
			}

			did_read_shift_register = false;
		}
	}

	// Check also for calls into the 0x3xx page above 0x320, as that's where the Oric's boot ROM is.
	for(const auto address: disassembly.outward_calls) {
		is_oric |= address >= 0x320 && address < 0x400;
	}

	if(is_oric) {
		targets.push_back(std::unique_ptr<Analyser::Static::Target>(OricTarget(sector_zero)));
	} else {
		targets.push_back(std::unique_ptr<Analyser::Static::Target>(AppleIITarget(sector_zero)));
	}
	targets.back()->media = media;
	return targets;
}